

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O2

void __thiscall
irr::video::COpenGLDriver::removeOcclusionQuery(COpenGLDriver *this,ISceneNode *node)

{
  array<irr::video::CNullDriver::SOccQuery> *this_00;
  pointer pSVar1;
  uint uVar2;
  code *pcVar3;
  SOccQuery local_48;
  
  this_00 = &(this->super_CNullDriver).OcclusionQueries;
  local_48.Mesh = (IMesh *)0x0;
  local_48.field_2.PID = (void *)0x0;
  local_48.Result = 0xffffffff;
  local_48.Run = 0xffffffff;
  if (node != (ISceneNode *)0x0) {
    *(int *)(node->_vptr_ISceneNode[-3] + -0x20 + (long)(node->AbsoluteTransformation).M) =
         *(int *)(node->_vptr_ISceneNode[-3] + -0x20 + (long)(node->AbsoluteTransformation).M) + 1;
  }
  local_48.Node = node;
  uVar2 = core::array<irr::video::CNullDriver::SOccQuery>::linear_search(this_00,&local_48);
  CNullDriver::SOccQuery::~SOccQuery(&local_48);
  if (uVar2 != 0xffffffff) {
    pSVar1 = (this_00->m_data).
             super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pSVar1[uVar2].field_2.UID != 0) &&
       ((pcVar3 = *(code **)&this->field_0xa40, pcVar3 != (code *)0x0 ||
        (pcVar3 = *(code **)&this->field_0xa80, pcVar3 != (code *)0x0)))) {
      (*pcVar3)(1,&pSVar1[uVar2].field_2);
    }
    CNullDriver::removeOcclusionQuery(&this->super_CNullDriver,node);
  }
  return;
}

Assistant:

void COpenGLDriver::removeOcclusionQuery(scene::ISceneNode *node)
{
	const s32 index = OcclusionQueries.linear_search(SOccQuery(node));
	if (index != -1) {
		if (OcclusionQueries[index].UID != 0)
			extGlDeleteQueries(1, reinterpret_cast<GLuint *>(&OcclusionQueries[index].UID));
		CNullDriver::removeOcclusionQuery(node);
	}
}